

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O1

WeakDiagStack * __thiscall
Js::ProbeContainer::GetFramePointers(ProbeContainer *this,DWORD_PTR dispatchHaltFrameAddress)

{
  LONG *pLVar1;
  int iVar2;
  DebugManager *this_00;
  Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *pSVar3;
  bool bVar4;
  DiagStackFrame **ppDVar5;
  ReferencedArenaAdapter *pRVar6;
  HeapAllocator *alloc;
  WeakDiagStack *pWVar7;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if ((this->framePointers == (DiagStack *)0x0) ||
     (this->debugSessionNumber < this->debugManager->debugSessionNumber)) {
    UpdateFramePointers(this,true,dispatchHaltFrameAddress);
    this_00 = this->debugManager;
    this->debugSessionNumber = this_00->debugSessionNumber;
    iVar2 = ((ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer> *)
            this->framePointers)->count;
    if (0 < iVar2) {
      ppDVar5 = JsUtil::ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                ::Item((ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                        *)this->framePointers,iVar2 + -1);
      bVar4 = DebugManager::IsMatchTopFrameStackAddress(this_00,*ppDVar5);
      if (bVar4) {
        ppDVar5 = JsUtil::
                  ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>::Item
                            ((ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                              *)this->framePointers,
                             ((ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                               *)this->framePointers)->count + -1);
        DiagStackFrame::SetIsTopFrame(*ppDVar5);
      }
    }
  }
  pRVar6 = DebugManager::GetDiagnosticArena(this->debugManager);
  local_40 = (undefined1  [8])
             &Memory::
              WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame*,Memory::ArenaAllocator,false,DefaultComparer>>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3f0604f;
  data.filename._0_4_ = 0xc0;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_40);
  pWVar7 = (WeakDiagStack *)new<Memory::HeapAllocator>(0x10,alloc,0x300d4a);
  pSVar3 = this->framePointers;
  pWVar7->adapter = pRVar6;
  pWVar7->p = pSVar3;
  LOCK();
  pLVar1 = &(pRVar6->super_RefCounted).refCount;
  *pLVar1 = *pLVar1 + 1;
  UNLOCK();
  return pWVar7;
}

Assistant:

WeakDiagStack * ProbeContainer::GetFramePointers(DWORD_PTR dispatchHaltFrameAddress)
    {
        if (framePointers == nullptr || this->debugSessionNumber < debugManager->GetDebugSessionNumber())
        {
            UpdateFramePointers(/*fMatchWithCurrentScriptContext*/true, dispatchHaltFrameAddress);
            this->debugSessionNumber = debugManager->GetDebugSessionNumber();

            if ((framePointers->Count() > 0) &&
                debugManager->IsMatchTopFrameStackAddress(framePointers->Peek(0)))
            {
                framePointers->Peek(0)->SetIsTopFrame();
            }
        }

        ReferencedArenaAdapter* pRefArena = debugManager->GetDiagnosticArena();
        return HeapNew(WeakDiagStack,pRefArena,framePointers);
    }